

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

int macro_getargtype(char *arg)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort *puVar4;
  int iVar5;
  ushort **ppuVar6;
  __int32_t **pp_Var7;
  t_symbol *ptVar8;
  ulong uVar9;
  
  ppuVar6 = __ctype_b_loc();
  puVar4 = *ppuVar6;
  do {
    cVar1 = *arg;
    arg = arg + 1;
  } while ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  pp_Var7 = __ctype_toupper_loc();
  iVar5 = (*pp_Var7)[cVar1];
  if (iVar5 < 0x41) {
    if (iVar5 == 0) {
      return 0;
    }
    if (iVar5 == 0x22) {
      return 5;
    }
    if (iVar5 == 0x23) {
      return 2;
    }
  }
  else if ((iVar5 - 0x58U < 2) || (iVar5 == 0x41)) {
    if (*arg == '\0') {
      return 1;
    }
  }
  else if (iVar5 == 0x5b) {
    return 4;
  }
  uVar9 = 0;
  do {
    bVar2 = arg[uVar9];
    uVar3 = puVar4[(char)bVar2];
    if (((uVar9 == 0) && ((uVar3 & 0x800) != 0)) ||
       (((uVar3 & 8) == 0 &&
        ((0x31 < bVar2 - 0x2e || ((0x2000000040001U >> ((ulong)(bVar2 - 0x2e) & 0x3f) & 1) == 0)))))
       ) goto LAB_0010dbcc;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x40);
  uVar9 = 0x40;
LAB_0010dbcc:
  iVar5 = 3;
  if (((int)uVar9 != 0) && (bVar2 == 0)) {
    strncpy(symbol + 1,arg,uVar9 & 0xffffffff);
    symbol[0] = (char)uVar9;
    symbol[(uVar9 & 0xffffffff) + 1] = '\0';
    ptVar8 = stlook(0);
    iVar5 = 6;
    if ((ptVar8 != (t_symbol *)0x0) && (1 < ptVar8->type - 1U)) {
      iVar5 = (uint)(ptVar8->bank != 0xf0) * 3 + 3;
    }
  }
  return iVar5;
}

Assistant:

int
macro_getargtype(char *arg)
{
	struct t_symbol *sym;
	char c;
	int  i;

	/* skip spaces */
	while (isspace(*arg))
		arg++;

	/* get type */
	switch (toupper(*arg++)) {
	case '\0':
		return (NO_ARG);

	case '"':
		return (ARG_STRING);

	case '#':
		return (ARG_IMM);

	case '[':
		return (ARG_INDIRECT);

	case 'A':
	case 'X':
	case 'Y':
		if (*arg == '\0')
			return (ARG_REG);

	default:
		/* symbol */
		c = arg[0];
		for(i = 0; i < SBOLSZ; i++) {
			c = arg[i];
			if (isdigit(c) && (i == 0))
				break;
			if ((!isalnum(c)) && (c != '_') && (c != '.') && (c != '@'))
				break;
		}

		if (i == 0)
			return (ARG_ABS);
		else {
			if (c != '\0')
				return (ARG_ABS);
			else {
				strncpy(&symbol[1], arg, i);
				symbol[0] = i;
				symbol[i+1] = '\0';

				if ((sym = stlook(0)) == NULL)
					return (ARG_LABEL);
				else {
					if((sym->type == UNDEF) || (sym->type == IFUNDEF))
						return (ARG_LABEL);
					if (sym->bank == RESERVED_BANK)
						return (ARG_ABS);
					else
						return (ARG_LABEL);
				}
			}
		}
	}
}